

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
libcellml::GeneratorProfile::setInterfaceComputeVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *interfaceComputeVariablesMethodString)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)&(this->mPimpl->mInterfaceComputeVariablesMethodFamWoevString)._M_dataplus._M_p
             + (ulong)(uint)((int)CONCAT71(in_register_00000031,forDifferentialModel) << 7 |
                            (int)CONCAT71(in_register_00000011,withExternalVariables) << 6)));
  return;
}

Assistant:

void GeneratorProfile::setInterfaceComputeVariablesMethodString(bool forDifferentialModel,
                                                                bool withExternalVariables,
                                                                const std::string &interfaceComputeVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mInterfaceComputeVariablesMethodFdmWevString = interfaceComputeVariablesMethodString;
        } else {
            mPimpl->mInterfaceComputeVariablesMethodFdmWoevString = interfaceComputeVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mInterfaceComputeVariablesMethodFamWevString = interfaceComputeVariablesMethodString;
        } else {
            mPimpl->mInterfaceComputeVariablesMethodFamWoevString = interfaceComputeVariablesMethodString;
        }
    }
}